

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::Flower::normalizeConeType(Flower *this,PossibleContents *cone)

{
  bool bVar1;
  ConeType CVar2;
  PossibleContents local_78;
  uintptr_t local_58;
  Index local_4c;
  Type TStack_48;
  Index normalized;
  Index local_40;
  uintptr_t local_38;
  Index local_30;
  Index local_24;
  Type TStack_20;
  Index before;
  Type type;
  PossibleContents *cone_local;
  Flower *this_local;
  
  type.id = (uintptr_t)cone;
  bVar1 = PossibleContents::isConeType(cone);
  if (!bVar1) {
    __assert_fail("cone.isConeType()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                  ,0x85e,
                  "void wasm::(anonymous namespace)::Flower::normalizeConeType(PossibleContents &)")
    ;
  }
  TStack_20 = PossibleContents::getType(type.id);
  CVar2 = PossibleContents::getCone((PossibleContents *)type.id);
  TStack_48 = CVar2.type.id;
  local_40 = CVar2.depth;
  local_58 = TStack_20.id;
  local_38 = TStack_48.id;
  local_30 = local_40;
  local_24 = local_40;
  local_4c = getNormalizedConeDepth(this,TStack_20,local_40);
  if (local_4c != local_24) {
    PossibleContents::coneType(&local_78,TStack_20,local_4c);
    PossibleContents::operator=((PossibleContents *)type.id,&local_78);
    PossibleContents::~PossibleContents(&local_78);
  }
  return;
}

Assistant:

void normalizeConeType(PossibleContents& cone) {
    assert(cone.isConeType());
    auto type = cone.getType();
    auto before = cone.getCone().depth;
    auto normalized = getNormalizedConeDepth(type, before);
    if (normalized != before) {
      cone = PossibleContents::coneType(type, normalized);
    }
  }